

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

string * __thiscall
spirv_cross::Compiler::get_remapped_declared_block_name_abi_cxx11_
          (string *__return_storage_ptr__,Compiler *this,uint32_t id,
          bool fallback_prefer_instance_name)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  SPIRVariable *pSVar3;
  SPIRType *pSVar4;
  Meta *pMVar5;
  ulong uVar6;
  _Hash_node_base *p_Var7;
  __node_base_ptr p_Var8;
  __node_base_ptr p_Var9;
  
  uVar1 = (this->declared_block_names)._M_h._M_bucket_count;
  uVar6 = (ulong)id % uVar1;
  p_Var8 = (this->declared_block_names)._M_h._M_buckets[uVar6];
  p_Var9 = (__node_base_ptr)0x0;
  if ((p_Var8 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var8->_M_nxt, p_Var9 = p_Var8, *(uint32_t *)&p_Var8->_M_nxt[1]._M_nxt != id)) {
    while (p_Var8 = p_Var2, p_Var2 = p_Var8->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var9 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var2[1]._M_nxt % uVar1 != uVar6) ||
         (p_Var9 = p_Var8, *(uint *)&p_Var2[1]._M_nxt == id)) goto LAB_002ce65b;
    }
    p_Var9 = (__node_base_ptr)0x0;
  }
LAB_002ce65b:
  if (p_Var9 == (__node_base_ptr)0x0) {
    p_Var2 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var2 = p_Var9->_M_nxt;
  }
  if (p_Var2 == (_Hash_node_base *)0x0) {
    pSVar3 = Variant::get<spirv_cross::SPIRVariable>
                       ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + id);
    if (fallback_prefer_instance_name) {
      (*this->_vptr_Compiler[6])
                (__return_storage_ptr__,this,(ulong)(pSVar3->super_IVariant).self.id,1);
      return __return_storage_ptr__;
    }
    pSVar4 = Variant::get<spirv_cross::SPIRType>
                       ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                        *(uint *)&(pSVar3->super_IVariant).field_0xc);
    pMVar5 = ParsedIR::find_meta(&this->ir,(ID)(pSVar4->super_IVariant).self.id);
    if ((pMVar5 == (Meta *)0x0) ||
       (p_Var2 = (_Hash_node_base *)(pMVar5->decoration).alias._M_string_length,
       p_Var2 == (_Hash_node_base *)0x0)) {
      (*this->_vptr_Compiler[4])(__return_storage_ptr__,this,(ulong)id);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    p_Var7 = (_Hash_node_base *)(pMVar5->decoration).alias._M_dataplus._M_p;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    p_Var7 = p_Var2[2]._M_nxt;
    p_Var2 = p_Var2[3]._M_nxt;
  }
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,p_Var7,
             (pointer)((long)&p_Var7->_M_nxt + (long)&p_Var2->_M_nxt));
  return __return_storage_ptr__;
}

Assistant:

std::string Compiler::get_remapped_declared_block_name(uint32_t id, bool fallback_prefer_instance_name) const
{
	auto itr = declared_block_names.find(id);
	if (itr != end(declared_block_names))
	{
		return itr->second;
	}
	else
	{
		auto &var = get<SPIRVariable>(id);

		if (fallback_prefer_instance_name)
		{
			return to_name(var.self);
		}
		else
		{
			auto &type = get<SPIRType>(var.basetype);
			auto *type_meta = ir.find_meta(type.self);
			auto *block_name = type_meta ? &type_meta->decoration.alias : nullptr;
			return (!block_name || block_name->empty()) ? get_block_fallback_name(id) : *block_name;
		}
	}
}